

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O3

int map_insert_array(map m,map_key *keys,map_value *values,size_t size)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_t sVar4;
  
  if (values == (map_value *)0x0 || (keys == (map_key *)0x0 || m == (map)0x0)) {
    pcVar3 = "Invalid map insertion parameters";
    uVar2 = 0xde;
LAB_00103243:
    log_write_impl_va("metacall",uVar2,"map_insert_array",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                      ,3,pcVar3);
    iVar1 = 1;
  }
  else {
    if (size != 0) {
      sVar4 = 0;
      do {
        iVar1 = map_insert(m,keys[sVar4],values[sVar4]);
        if (iVar1 != 0) {
          pcVar3 = "Invalid map array insertion";
          uVar2 = 0xe6;
          goto LAB_00103243;
        }
        sVar4 = sVar4 + 1;
      } while (size != sVar4);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int map_insert_array(map m, map_key keys[], map_value values[], size_t size)
{
	size_t iterator;

	if (m == NULL || keys == NULL || values == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid map insertion parameters");
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (map_insert(m, keys[iterator], values[iterator]) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid map array insertion");
			return 1;
		}
	}

	return 0;
}